

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<false> *handler)

{
  Ch *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  byte *pbVar3;
  _func_int **pp_Var4;
  long lVar5;
  byte *pbVar6;
  ulong uVar7;
  SizeType memberCount;
  uint uVar8;
  BaseState<false> *pBVar9;
  undefined4 extraout_var_00;
  
  is->src_ = is->src_ + 1;
  pBVar9 = (handler->ctx).current_state;
  iVar2 = (*pBVar9->_vptr_BaseState[5])(pBVar9,handler);
  if ((BaseState<false> *)CONCAT44(extraout_var,iVar2) != (BaseState<false> *)0x0) {
    (handler->ctx).previous_state = (handler->ctx).current_state;
    (handler->ctx).current_state = (BaseState<false> *)CONCAT44(extraout_var,iVar2);
    pbVar3 = (byte *)is->src_;
    while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
      pbVar3 = pbVar3 + 1;
    }
    is->src_ = (Ch *)pbVar3;
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if (*pbVar3 == 0x7d) {
      is->src_ = (Ch *)(pbVar3 + 1);
      pBVar9 = (handler->ctx).current_state;
      pp_Var4 = pBVar9->_vptr_BaseState;
      uVar7 = 0;
    }
    else {
      uVar8 = 0;
      while( true ) {
        if (*is->src_ != '\"') {
          lVar5 = (long)is->src_ - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 4;
          goto LAB_00115bda;
        }
        ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                  (this,is,handler,true);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pbVar3 = (byte *)is->src_;
        while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
          pbVar3 = pbVar3 + 1;
        }
        is->src_ = (Ch *)pbVar3;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        if (*pbVar3 != 0x3a) {
          lVar5 = (long)is->src_ - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 5;
          goto LAB_00115bda;
        }
        pbVar3 = pbVar3 + 1;
        is->src_ = (Ch *)pbVar3;
        while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
          pbVar3 = pbVar3 + 1;
        }
        is->src_ = (Ch *)pbVar3;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pbVar3 = (byte *)is->src_;
        pbVar6 = pbVar3;
        while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
          pbVar3 = pbVar3 + 1;
          pbVar6 = pbVar6 + 1;
        }
        is->src_ = (Ch *)pbVar3;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        uVar8 = uVar8 + 1;
        if (*pbVar3 != 0x2c) break;
        pbVar3 = pbVar3 + 1;
        is->src_ = (Ch *)pbVar3;
        while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
          pbVar3 = pbVar3 + 1;
        }
        is->src_ = (Ch *)pbVar3;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
      }
      if (*pbVar3 != 0x7d) {
        pCVar1 = is->head_;
        *(undefined4 *)(this + 0x30) = 6;
        *(long *)(this + 0x38) = (long)pbVar6 - (long)pCVar1;
        return;
      }
      is->src_ = (Ch *)(pbVar3 + 1);
      pBVar9 = (handler->ctx).current_state;
      pp_Var4 = pBVar9->_vptr_BaseState;
      uVar7 = (ulong)uVar8;
    }
    iVar2 = (*pp_Var4[7])(pBVar9,handler,uVar7);
    if ((BaseState<false> *)CONCAT44(extraout_var_00,iVar2) != (BaseState<false> *)0x0) {
      (handler->ctx).previous_state = (handler->ctx).current_state;
      (handler->ctx).current_state = (BaseState<false> *)CONCAT44(extraout_var_00,iVar2);
      return;
    }
  }
  lVar5 = (long)is->src_ - (long)is->head_;
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_00115bda:
  *(long *)(this + 0x38) = lVar5;
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler)
  { RAPIDJSON_ASSERT(is.Peek() == '{');
    is.Take();  // Skip '{'

    if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
      RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

    SkipWhitespaceAndComments<parseFlags>(is);
    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

    if (Consume(is, '}'))
    { if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
      return;
    }

    for (SizeType memberCount = 0;;)
    { if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
        RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

      ParseString<parseFlags>(is, handler, true);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      SkipWhitespaceAndComments<parseFlags>(is);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
        RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

      SkipWhitespaceAndComments<parseFlags>(is);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      ParseValue<parseFlags>(is, handler);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      SkipWhitespaceAndComments<parseFlags>(is);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      ++memberCount;

      switch (is.Peek())
      { case ',':
          is.Take();
          SkipWhitespaceAndComments<parseFlags>(is);
          RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
          break;
        case '}':
          is.Take();
          if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
          return;
        default:
          RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
      }

      if (parseFlags & kParseTrailingCommasFlag)
      { if (is.Peek() == '}')
        { if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
          is.Take();
          return;
        }
      }
    }
  }